

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::modifyTailCodes(string *unit_string)

{
  array<std::pair<const_char_*,_const_char_*>,_12UL> *paVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined8 local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 local_80;
  size_t local_78;
  size_t sz;
  allocator local_59;
  string local_58;
  const_iterator local_38;
  value_type *endTemp;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::pair<const_char_*,_const_char_*>,_12UL> *__range2;
  string *unit_string_local;
  
  __range2 = (array<std::pair<const_char_*,_const_char_*>,_12UL> *)unit_string;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     ((pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == 'F' ||
      (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == 'C')))) {
    __begin2 = modifyTailCodes::trailTempCodeReplacements._M_elems;
    __end2 = std::array<std::pair<const_char_*,_const_char_*>,_12UL>::begin
                       (&modifyTailCodes::trailTempCodeReplacements);
    endTemp = std::array<std::pair<const_char_*,_const_char_*>,_12UL>::end
                        (&modifyTailCodes::trailTempCodeReplacements);
    for (; paVar1 = __range2, __end2 != endTemp; __end2 = __end2 + 1) {
      local_38 = __end2;
      pcVar4 = __end2->first;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,pcVar4,&local_59);
      bVar2 = ends_with((string *)paVar1,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      if (bVar2) {
        local_78 = strlen(local_38->first);
        paVar1 = __range2;
        local_90._M_current = (char *)std::__cxx11::string::end();
        local_88 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_90,local_78);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
        local_a0._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_98,&local_a0);
        std::__cxx11::string::replace(paVar1,local_80,local_98,local_38->second);
        paVar1 = __range2;
        std::__cxx11::string::size();
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)paVar1);
        paVar1 = __range2;
        if (*pcVar4 != '_') {
          lVar5 = std::__cxx11::string::size();
          std::__cxx11::string::insert((ulong)paVar1,lVar5 - 4,'\x01');
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool modifyTailCodes(std::string& unit_string)
{
    if (!unit_string.empty() &&
        (unit_string.back() == 'F' || unit_string.back() == 'C')) {
        static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 12>
            trailTempCodeReplacements{{
                ckpair{"at39F", "[39]"},
                ckpair{"39F", "[39]"},
                ckpair{"at60F", "[60]"},
                ckpair{"60F", "[60]"},
                ckpair{"at20C", "[20]"},
                ckpair{"20C", "[20]"},
                ckpair{"at23C", "[23]"},
                ckpair{"23C", "[23]"},
                ckpair{"at4C", "[04]"},
                ckpair{"4C", "[04]"},
                ckpair{"at0C", "[00]"},
                ckpair{"0C", "[00]"},

            }};

        for (const auto& endTemp : trailTempCodeReplacements) {
            if (ends_with(unit_string, endTemp.first)) {
                auto sz = strlen(endTemp.first);
                unit_string.replace(
                    unit_string.end() - sz, unit_string.end(), endTemp.second);
                if (unit_string[unit_string.size() - 5] != '_') {
                    unit_string.insert(unit_string.size() - 4, 1, '_');
                }
                return true;
            }
        }
    }
    return false;
}